

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O2

double __thiscall
ON_RenderContent::ChildSlotAmount
          (ON_RenderContent *this,wchar_t *child_slot_name,double default_value)

{
  bool bVar1;
  Types TVar2;
  int iVar3;
  wchar_t *pwVar4;
  ON_wString s;
  ON_XMLVariant v;
  ON_wString local_220;
  double local_218;
  ON_wString local_210;
  ON_XMLVariant local_208;
  ON_XMLVariant local_110;
  
  local_218 = default_value;
  ON_wString::ON_wString((ON_wString *)&local_208,child_slot_name);
  ON_wString::operator+(&local_220,(wchar_t *)&local_208);
  ON_wString::~ON_wString((ON_wString *)&local_208);
  pwVar4 = ON_wString::operator_cast_to_wchar_t_(&local_220);
  (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x2d])(&local_208,this,pwVar4);
  bVar1 = ::ON_XMLVariant::IsNull(&local_208);
  if (bVar1) {
    ON_wString::ON_wString(&local_210,child_slot_name);
    ON_wString::operator+((ON_wString *)&local_110,(wchar_t *)&local_210);
    ON_wString::operator=(&local_220,(ON_wString *)&local_110);
    ON_wString::~ON_wString((ON_wString *)&local_110);
    ON_wString::~ON_wString(&local_210);
    pwVar4 = ON_wString::operator_cast_to_wchar_t_(&local_220);
    (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x2d])(&local_110,this,pwVar4)
    ;
    ::ON_XMLVariant::operator=(&local_208,&local_110);
    ::ON_XMLVariant::~ON_XMLVariant(&local_110);
    bVar1 = ::ON_XMLVariant::IsNull(&local_208);
    if (bVar1) goto LAB_005a5c19;
    TVar2 = ::ON_XMLVariant::Type(&local_208);
    if (TVar2 == Integer) {
      iVar3 = ::ON_XMLVariant::AsInteger(&local_208);
      local_218 = (double)iVar3;
      goto LAB_005a5c19;
    }
    local_218 = ::ON_XMLVariant::AsDouble(&local_208);
  }
  else {
    local_218 = ::ON_XMLVariant::AsDouble(&local_208);
  }
  local_218 = local_218 * 100.0;
LAB_005a5c19:
  ::ON_XMLVariant::~ON_XMLVariant(&local_208);
  ON_wString::~ON_wString(&local_220);
  return local_218;
}

Assistant:

double ON_RenderContent::ChildSlotAmount(const wchar_t* child_slot_name, double default_value) const
{
  // This is complicated. See https://mcneel.myjetbrains.com/youtrack/issue/RH-58417

  // Try to get the new double amount value in the range 0..1.
  auto s = ON_wString(child_slot_name) + L"-" MAT_POSTFIX_DOUBLE_AMOUNT;
  auto v = GetParameter(s);
  if (!v.IsNull())
  {
    // Got it, so return it in the range 0..100.
    return v.AsDouble() * 100.0;
  }

  // Couldn't get it so get the legacy amount value. This value is problematic (which is why we added
  // the new double amount). The reason is that originally, the value was supposed to be in the range
  // 0..100, and the Physically Based material is an example of a material that does this. But due to
  // an oversight, the Custom Material saved this in the range 0..1. This means that here, in generic
  // code that doesn't know which class saved the data, we have to figure out what range it's in by
  // looking at the variant's type.
  s = ON_wString(child_slot_name) + L"-" MAT_POSTFIX_AMOUNT;
  v = GetParameter(s);
  if (!v.IsNull())
  {
    if (v.Type() == ON_XMLVariant::Types::Integer)
    {
      // Got it as an integer so it's already in the range 0..100.
      return double(v.AsInteger());
    }
    else
    {
      // The double value is in the range 0..1. Return it in the range 0..100.
      return v.AsDouble() * 100.0;
    }
  }

  return default_value;
}